

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<void> __thiscall kj::HttpServer::drain(HttpServer *this)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_00;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_01;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_02;
  ImmediatePromiseNode<kj::_::Void> *pIVar5;
  long in_RSI;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar6;
  Promise<void> PVar7;
  Fault f;
  Fault local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined8 uStack_20;
  
  if (*(char *)(in_RSI + 0x50) == '\x01') {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x13b6,FAILED,"!draining","\"you can only call drain() once\"",
               (char (*) [31])"you can only call drain() once");
    _::Debug::Fault::fatal(&local_38);
  }
  *(undefined1 *)(in_RSI + 0x50) = 1;
  (**(code **)**(undefined8 **)(in_RSI + 0x70))(*(undefined8 **)(in_RSI + 0x70),&local_38);
  if (*(int *)(in_RSI + 0x78) == 0) {
    OVar6 = heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_38);
    pIVar5 = OVar6.ptr;
  }
  else {
    newPromiseAndFulfiller<void>();
    puVar1 = *(undefined8 **)(in_RSI + 0x80);
    plVar2 = *(long **)(in_RSI + 0x88);
    uVar3 = (undefined4)uStack_20;
    uVar4 = uStack_20._4_4_;
    uStack_20 = (long *)0x0;
    *(undefined4 *)(in_RSI + 0x80) = local_28;
    *(undefined4 *)(in_RSI + 0x84) = uStack_24;
    *(undefined4 *)(in_RSI + 0x88) = uVar3;
    *(undefined4 *)(in_RSI + 0x8c) = uVar4;
    if (plVar2 != (long *)0x0) {
      (**(code **)*puVar1)(puVar1,(long)plVar2 + *(long *)(*plVar2 + -0x10));
      plVar2 = uStack_20;
      *(undefined4 *)&(this->super_ErrorHandler)._vptr_ErrorHandler = local_38.exception._0_4_;
      *(undefined4 *)((long)&(this->super_ErrorHandler)._vptr_ErrorHandler + 4) =
           local_38.exception._4_4_;
      *(undefined4 *)&this->timer = (undefined4)uStack_30;
      *(undefined4 *)((long)&this->timer + 4) = uStack_30._4_4_;
      uStack_30 = (long *)0x0;
      pIVar5 = extraout_RDX_00;
      if (uStack_20 != (long *)0x0) {
        uStack_20 = (long *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(uStack_24,local_28))
                  ((undefined8 *)CONCAT44(uStack_24,local_28),
                   (long)plVar2 + *(long *)(*plVar2 + -0x10));
        plVar2 = uStack_30;
        pIVar5 = extraout_RDX_01;
        if (uStack_30 != (long *)0x0) {
          uStack_30 = (long *)0x0;
          (*(code *)**(undefined8 **)CONCAT44(local_38.exception._4_4_,local_38.exception._0_4_))
                    ((undefined8 *)CONCAT44(local_38.exception._4_4_,local_38.exception._0_4_),
                     (long)plVar2 + *(long *)(*plVar2 + -0x10));
          pIVar5 = extraout_RDX_02;
        }
      }
      goto LAB_002b6b20;
    }
    pIVar5 = extraout_RDX;
  }
  *(undefined4 *)&(this->super_ErrorHandler)._vptr_ErrorHandler = local_38.exception._0_4_;
  *(undefined4 *)((long)&(this->super_ErrorHandler)._vptr_ErrorHandler + 4) =
       local_38.exception._4_4_;
  *(undefined4 *)&this->timer = (undefined4)uStack_30;
  *(undefined4 *)((long)&this->timer + 4) = uStack_30._4_4_;
LAB_002b6b20:
  PVar7.super_PromiseBase.node.ptr = (PromiseNode *)pIVar5;
  PVar7.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar7.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> HttpServer::drain() {
  KJ_REQUIRE(!draining, "you can only call drain() once");

  draining = true;
  drainFulfiller->fulfill();

  if (connectionCount == 0) {
    return kj::READY_NOW;
  } else {
    auto paf = kj::newPromiseAndFulfiller<void>();
    zeroConnectionsFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }
}